

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O2

void makeContextCurrentOSMesa(_GLFWwindow *window)

{
  int iVar1;
  undefined8 in_RAX;
  void *block;
  int height;
  int width;
  
  if (window != (_GLFWwindow *)0x0) {
    _height = in_RAX;
    (*_glfw.platform.getFramebufferSize)(window,&width,&height);
    block = (window->context).osmesa.buffer;
    if (((block == (void *)0x0) || (width != (window->context).osmesa.width)) ||
       (height != (window->context).osmesa.height)) {
      _glfw_free(block);
      block = _glfw_calloc(4,(long)height * (long)width);
      (window->context).osmesa.buffer = block;
      (window->context).osmesa.width = width;
      (window->context).osmesa.height = height;
    }
    iVar1 = (*_glfw.osmesa.MakeCurrent)((window->context).osmesa.handle,block,0x1401,width,height);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"OSMesa: Failed to make context current");
      return;
    }
  }
  _glfwPlatformSetTls(&_glfw.contextSlot,window);
  return;
}

Assistant:

static void makeContextCurrentOSMesa(_GLFWwindow* window)
{
    if (window)
    {
        int width, height;
        _glfw.platform.getFramebufferSize(window, &width, &height);

        // Check to see if we need to allocate a new buffer
        if ((window->context.osmesa.buffer == NULL) ||
            (width != window->context.osmesa.width) ||
            (height != window->context.osmesa.height))
        {
            _glfw_free(window->context.osmesa.buffer);

            // Allocate the new buffer (width * height * 8-bit RGBA)
            window->context.osmesa.buffer = _glfw_calloc(4, (size_t) width * height);
            window->context.osmesa.width  = width;
            window->context.osmesa.height = height;
        }

        if (!OSMesaMakeCurrent(window->context.osmesa.handle,
                               window->context.osmesa.buffer,
                               GL_UNSIGNED_BYTE,
                               width, height))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "OSMesa: Failed to make context current");
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}